

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O0

void helicsFilterAddDeliveryEndpoint(HelicsFilter filt,char *delivery,HelicsError *err)

{
  string_view endpoint;
  CloningFilter *this;
  HelicsError *in_RDX;
  char *in_RSI;
  CloningFilter *filter;
  char *in_stack_ffffffffffffffc8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd0;
  HelicsFilter in_stack_ffffffffffffffd8;
  
  this = anon_unknown.dwarf_88686::getCloningFilter
                   (in_stack_ffffffffffffffd8,(HelicsError *)in_stack_ffffffffffffffd0);
  if (this != (CloningFilter *)0x0) {
    if (in_RSI == (char *)0x0) {
      assignError(in_RDX,-4,"The supplied string argument is null and therefore invalid");
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      endpoint._M_str = in_RSI;
      endpoint._M_len = (size_t)in_RDX;
      helics::CloningFilter::addDeliveryEndpoint(this,endpoint);
    }
  }
  return;
}

Assistant:

void helicsFilterAddDeliveryEndpoint(HelicsFilter filt, const char* delivery, HelicsError* err)
{
    auto* filter = getCloningFilter(filt, err);
    if (filter == nullptr) {
        return;
    }
    CHECK_NULL_STRING(delivery, void());
    try {
        filter->addDeliveryEndpoint(delivery);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}